

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

int __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
::RemoveEntry(WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
              *this,int i,int previous,uint bucket)

{
  int iVar1;
  Type p_Var2;
  int *piVar3;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar4;
  
  pWVar4 = (this->entries).ptr;
  piVar3 = &pWVar4[(uint)previous].next;
  if (previous < 0) {
    piVar3 = (this->buckets).ptr + bucket;
  }
  iVar1 = pWVar4[i].next;
  *piVar3 = iVar1;
  p_Var2 = (this->entryRemovalCallback).fnCallback;
  if (p_Var2 != (Type)0x0) {
    (*p_Var2)(pWVar4 + i,(this->entryRemovalCallback).cookie.ptr);
    pWVar4 = (this->entries).ptr;
  }
  pWVar4[i].next = this->freeList;
  pWVar4[i].key.ptr = (RecyclerWeakReference<Js::RecyclableObject> *)0x0;
  (this->entries).ptr[i].hash = 0;
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  this->version = this->version + 1;
  return iVar1;
}

Assistant:

int RemoveEntry(int i, int previous, uint bucket)
        {
            int next = entries[i].next;

            if (previous < 0) // Previous < 0 => first node
            {
                buckets[bucket] = entries[i].next;
            }
            else
            {
                entries[previous].next = entries[i].next;
            }

            if (this->entryRemovalCallback.fnCallback != nullptr)
            {
                this->entryRemovalCallback.fnCallback(entries[i], this->entryRemovalCallback.cookie);
            }

            entries[i].next = freeList;
            entries[i].key = nullptr;
            entries[i].hash = EntryType::INVALID_HASH_VALUE;
            // Hold onto the pid here so that we can reuse it
            // entries[i].value = nullptr;
            freeList = i;
            freeCount++;
            version++;

            return next;
        }